

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

uint64_t decodeBitsAndAdvance(uint8_t **data)

{
  byte *pbVar1;
  long lVar2;
  uint64_t mask;
  uint64_t value;
  uint8_t **data_local;
  
  pbVar1 = *data;
  *data = pbVar1 + 1;
  mask = 0x80;
  value = (uint64_t)*pbVar1;
  while ((value & mask) != 0) {
    lVar2 = value - mask;
    pbVar1 = *data;
    *data = pbVar1 + 1;
    mask = mask << 7;
    value = lVar2 * 0x100 | (ulong)*pbVar1;
  }
  return value;
}

Assistant:

static inline uint64_t decodeBitsAndAdvance(const uint8_t*& data)
{
	uint64_t value = *data++;
	uint64_t mask = 0x80;
	while (value & mask) {
		value = ((value - mask) << 8) | (*data++);
		mask <<= 7;
	}
	return value;
}